

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcObj.c
# Opt level: O0

Abc_Obj_t * Abc_NtkFindOrCreateNet(Abc_Ntk_t *pNtk,char *pName)

{
  int iVar1;
  Abc_Obj_t *pNet;
  char *pName_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsNetlist(pNtk);
  if (iVar1 != 0) {
    if (((pName == (char *)0x0) ||
        (pNtk_local = (Abc_Ntk_t *)Abc_NtkFindNet(pNtk,pName), pNtk_local == (Abc_Ntk_t *)0x0)) &&
       (pNtk_local = (Abc_Ntk_t *)Abc_NtkCreateNet(pNtk), pName != (char *)0x0)) {
      Nm_ManStoreIdName(pNtk->pManName,*(int *)&pNtk_local->pSpec,
                        *(uint *)((long)&pNtk_local->pSpec + 4) & 0xf,pName,(char *)0x0);
    }
    return (Abc_Obj_t *)pNtk_local;
  }
  __assert_fail("Abc_NtkIsNetlist(pNtk)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcObj.c"
                ,0x24d,"Abc_Obj_t *Abc_NtkFindOrCreateNet(Abc_Ntk_t *, char *)");
}

Assistant:

Abc_Obj_t * Abc_NtkFindOrCreateNet( Abc_Ntk_t * pNtk, char * pName )
{
    Abc_Obj_t * pNet;
    assert( Abc_NtkIsNetlist(pNtk) );
    if ( pName && (pNet = Abc_NtkFindNet( pNtk, pName )) )
        return pNet;
//printf( "Creating net %s.\n", pName );
    // create a new net
    pNet = Abc_NtkCreateNet( pNtk );
    if ( pName )
        Nm_ManStoreIdName( pNtk->pManName, pNet->Id, pNet->Type, pName, NULL );
    return pNet;
}